

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O1

QDomNodePrivate * __thiscall
QDomNodePrivate::insertAfter
          (QDomNodePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  QDomNodePrivate **ppQVar1;
  undefined1 *puVar2;
  QDomNodePrivate *pQVar3;
  QDomNodePrivate *pQVar4;
  int iVar5;
  QDomNodePrivate *pQVar6;
  QDomNodePrivate *pQVar7;
  QDomNodePrivate *p;
  
  if (newChild == refChild || newChild == (QDomNodePrivate *)0x0) {
    return (QDomNodePrivate *)0x0;
  }
  pQVar7 = this;
  if ((refChild == (QDomNodePrivate *)0x0) ||
     ((pQVar6 = (QDomNodePrivate *)0x0, (refChild->field_0x98 & 2) != 0 &&
      (refChild->ownerNode == this)))) {
    while (iVar5 = (*pQVar7->_vptr_QDomNodePrivate[0xb])(pQVar7), iVar5 != 9) {
      puVar2 = &pQVar7->field_0x98;
      pQVar7 = pQVar7->ownerNode;
      if (((*puVar2 & 2) == 0) || (pQVar7 == (QDomNodePrivate *)0x0)) break;
    }
    if (pQVar7 != (QDomNodePrivate *)0x0) {
      pQVar7[1].prev = (QDomNodePrivate *)((long)&(pQVar7[1].prev)->_vptr_QDomNodePrivate + 1);
    }
    iVar5 = (*newChild->_vptr_QDomNodePrivate[0xb])(newChild);
    pQVar6 = newChild;
    if (iVar5 == 0xb) {
      pQVar7 = newChild->first;
      if (pQVar7 != (QDomNodePrivate *)0x0) {
        ppQVar1 = &newChild->first;
        do {
          pQVar7->ownerNode = this;
          pQVar7->field_0x98 = pQVar7->field_0x98 | 2;
          pQVar7 = pQVar7->next;
        } while (pQVar7 != (QDomNodePrivate *)0x0);
        if ((refChild == (QDomNodePrivate *)0x0) ||
           (pQVar7 = refChild->next, pQVar7 == (QDomNodePrivate *)0x0)) {
          pQVar7 = this->last;
          if (pQVar7 != (QDomNodePrivate *)0x0) {
            pQVar7->next = *ppQVar1;
          }
          pQVar3 = *ppQVar1;
          pQVar3->prev = pQVar7;
          if (this->first == (QDomNodePrivate *)0x0) {
            this->first = pQVar3;
          }
          this->last = newChild->last;
        }
        else {
          pQVar3 = newChild->first;
          pQVar3->prev = refChild;
          pQVar4 = newChild->last;
          pQVar4->next = pQVar7;
          refChild->next->prev = pQVar4;
          refChild->next = pQVar3;
        }
        *ppQVar1 = (QDomNodePrivate *)0x0;
        newChild->last = (QDomNodePrivate *)0x0;
      }
    }
    else {
      pQVar7 = newChild->ownerNode;
      if (pQVar7 != (QDomNodePrivate *)0x0 && (newChild->field_0x98 & 2) != 0) {
        (*pQVar7->_vptr_QDomNodePrivate[6])(pQVar7,newChild);
      }
      LOCK();
      (newChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (newChild->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      newChild->field_0x98 = newChild->field_0x98 | 2;
      newChild->ownerNode = this;
      if ((refChild == (QDomNodePrivate *)0x0) ||
         (pQVar7 = refChild->next, pQVar7 == (QDomNodePrivate *)0x0)) {
        pQVar7 = this->last;
        if (pQVar7 != (QDomNodePrivate *)0x0) {
          pQVar7->next = newChild;
        }
        newChild->prev = pQVar7;
        if (this->first == (QDomNodePrivate *)0x0) {
          this->first = newChild;
        }
        this->last = newChild;
      }
      else {
        newChild->prev = refChild;
        newChild->next = pQVar7;
        refChild->next->prev = newChild;
        refChild->next = newChild;
      }
    }
  }
  return pQVar6;
}

Assistant:

QDomNodePrivate* QDomNodePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Error check
    if (!newChild)
        return nullptr;

    // Error check
    if (newChild == refChild)
        return nullptr;

    // Error check
    if (refChild && refChild->parent() != this)
        return nullptr;

    // "mark lists as dirty"
    QDomDocumentPrivate *const doc = ownerDocument();
    if (doc)
        doc->nodeListTime++;

    // Special handling for inserting a fragment. We just insert
    // all elements of the fragment instead of the fragment itself.
    if (newChild->isDocumentFragment()) {
        // Fragment is empty ?
        if (newChild->first == nullptr)
            return newChild;

        // New parent
        QDomNodePrivate* n = newChild->first;
        while (n) {
            n->setParent(this);
            n = n->next;
        }

        // Insert at the end
        if (!refChild || refChild->next == nullptr) {
            if (last)
                last->next = newChild->first;
            newChild->first->prev = last;
            if (!first)
                first = newChild->first;
            last = newChild->last;
        } else { // Insert in the middle
            newChild->first->prev = refChild;
            newChild->last->next = refChild->next;
            refChild->next->prev = newChild->last;
            refChild->next = newChild->first;
        }

        // No need to increase the reference since QDomDocumentFragment
        // does not decrease the reference.

        // Remove the nodes from the fragment
        newChild->first = nullptr;
        newChild->last = nullptr;
        return newChild;
    }

    // Release new node from its current parent
    if (newChild->parent())
        newChild->parent()->removeChild(newChild);

    // No more errors can occur now, so we take
    // ownership of the node
    newChild->ref.ref();

    newChild->setParent(this);

    // Insert at the end
    if (!refChild) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    if (refChild->next == nullptr) {
        if (last)
            last->next = newChild;
        newChild->prev = last;
        if (!first)
            first = newChild;
        last = newChild;
        return newChild;
    }

    newChild->prev = refChild;
    newChild->next = refChild->next;
    refChild->next->prev = newChild;
    refChild->next = newChild;

    return newChild;
}